

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestStrings(void)

{
  WJTL_STATUS WVar1;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  WVar1 = VerifyOutputString("string","\"string\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"string\", \"\\\"string\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x102);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(anon_var_dwarf_39d + 10,"null",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\", \"null\", 0 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x103);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString((char *)0x0,"null",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( ((void*)0), \"null\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x104);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(" string ","\" string \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" string \", \"\\\" string \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x106);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(" ","\" \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" \", \"\\\" \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x107);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("it\'s","\"it\'s\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\\\"it\'s\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x108);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\n","\"\\n\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\n\", \"\\\"\\\\n\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x109);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x01\x02\x03\x04\x05\x06\a\b",
                             "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x01\\x02\\x03\\x04\\x05\\x06\\x07\\x08\", \"\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10a);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\t\n\v\f\r\x0e\x0f\x10","\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\""
                             ,false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x09\\x0a\\x0b\\x0c\\x0d\\x0e\\x0f\\x10\", \"\\\"\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\\u000f\\\\u0010\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x11\x12\x13\x14\x15\x16\x17\x18",
                             "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x11\\x12\\x13\\x14\\x15\\x16\\x17\\x18\", \"\\\"\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\\\\u0018\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10c);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("\x19\x1a\x1b\x1c\x1d\x1e\x1f ",
                             "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x19\\x1a\\x1b\\x1c\\x1d\\x1e\\x1f\\x20\", \"\\\"\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10d);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("_\"_","\"_\\\"_\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\"_\", \"\\\"_\\\\\\\"_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10f);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("_\\_","\"_\\\\_\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\\_\", \"\\\"_\\\\\\\\_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x110);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString(anon_var_dwarf_445,anon_var_dwarf_58a9,false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\xF0\\x9F\\x98\\x81\", \"\\\"\\xF0\\x9F\\x98\\x81\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x111);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyInvalidString(anon_var_dwarf_58cb);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyInvalidString( \"\\xF0\\x9F\\x98Truncated\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x113);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputString("it\'s","\'it\\\'s\'",true);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\'it\\\\\'s\'\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x116);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestStrings
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test valid strings
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "   \"SingleString\"   ", "SingleString" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"SingleString\"", "SingleString" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Single'String\"", "Single'String" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"a\"", "a" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\"", NULL ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\n\"", "\n" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\" \\b \\n \\r \\\" \\\\ \\f \\t \\/ \"", " \b \n \r \" \\ \f \t / " ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\" \\u0000 \"", " \xc0\x80 " ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0000\\u0001\\u0002\\u0003 \\u0004\\u0005\\u0006\\u0007\"", "\xc0\x80\x01\x02\x03 \x04\x05\x06\x07" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0008\\u0009\\u000a\\u000b \\u000c\\u000d\\u000e\\u000f\"", "\b\t\n\x0b \x0c\r\x0e\x0f" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0010\\u0011\\u0012\\u0013 \\u0014\\u0015\\u0016\\u0017\"", "\x10\x11\x12\x13 \x14\x15\x16\x17" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\u0018\\u0019\\u001a\\u001b \\u001c\\u001d\\u001e\\u001f\"", "\x18\x19\x1a\x1b \x1c\x1d\x1e\x1f" ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\ud83d\\ude01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\uD83D\\ude01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\ud83d\\uDE01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"\\uD83D\\uDE01\"", "\xF0\x9F\x98\x81" ) );    // smiley face emoji
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "null", NULL ) );

    // Test valid objects that are not strings
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "1234" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "true" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "false" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "{ \"Dictionary\" : \"String\" }" ) );
    JL_ASSERT_SUCCESS( VerifyJsonNotString( IsJson5, "[ \"List\" ]" ) );

    // Test valid json5 strings
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "'SingleString'", "SingleString" ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "'Single\"String'", "Single\"String" ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Split\\\nString\"", "SplitString" ) );  // escaped new line in string
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Split\\\r\\\nString\"", "SplitString" ) );  // fully escaped cr and lf in string
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsStringObject( IsJson5, "\"Windows\\\r\nNewLine\"", "WindowsNewLine" ) );  // windows escaped crlf
    }

    // Test invalid strings
    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 'SingleString' ", 1 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\t\n \"SingleString' ", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "    SingleString ", 4 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Single\nString\"", 7 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " \"SingleString'", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 'SingleString\"", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " \"Noend", 1 ) );

    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Windows\\\n\rCRLF Wrong\"", 10 ) );  // don't allow single escaped LF CR (wrong order)

    // Check doesn't allow a string following a string
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"Single\" \"String\"", 8 ) );
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "'Single' 'String'", 8 ) );
    }

    // Test invalid escapes
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\a6789\"", 5 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\x11 6789\"", 5 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\Ud83d\\Ude01\"", 5 ) );    // uppercase \U
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\Ud83d\\ude01\"", 5 ) );    // uppercase \U
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83dXX\"", 5 ) ); // Too short for second surrogate
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83dXXXXXXX\"", 5 ) ); // Missing second surrogate
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ud83d\\ud83dXX\"", 5 ) ); // Second surrogate not low
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "\"1234\\ude01\\ud83dXX\"", 5 ) ); // surrogates swapped (low first)

    return TestReturn;
}